

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseExtraBuffers
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this)

{
  ulong uVar1;
  StreamBlock *pSVar2;
  StreamBlock *pSVar3;
  ulong uVar4;
  
  uVar4 = 0;
  if (this->RememberLength <= this->Pos) {
    uVar4 = this->Pos - this->RememberLength;
  }
  if (((this->Markers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (uVar1 = *(ulong *)((this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1),
     uVar1 < uVar4)) {
    uVar4 = uVar1;
  }
  while ((((pSVar2 = this->pFirstBlock, pSVar2->Index < uVar4 && (pSVar2 != this->pThisBlock)) &&
          (pSVar3 = pSVar2->pNext, pSVar3 != (StreamBlock *)0x0)) && (pSVar3->Index <= uVar4))) {
    this->pFirstBlock = pSVar3;
    operator_delete(pSVar2,0x1018);
  }
  return;
}

Assistant:

void BacktrackingTokenStream<Token>::ReleaseExtraBuffers() noexcept {
    // Last valid index we have to keep track of
    // Specifically the smaller of:
    //   - the distance from RememberLength to Pos (or 0 if RememberLength > Pos);
    //   - if Markers has any keys, the first key in Markers.
    size_t lastIndex = Pos > RememberLength ? Pos - RememberLength : 0u;

    // Account for earliest marker
    if (!Markers.empty())
        lastIndex = std::min(lastIndex, Markers.cbegin()->first);

    // Free all blocks before lastIndex
    while (pFirstBlock->Index < lastIndex && pFirstBlock != pThisBlock &&
           pFirstBlock->pNext && pFirstBlock->pNext->Index <= lastIndex)
        delete std::exchange(pFirstBlock, pFirstBlock->pNext);
}